

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O0

void * des3_ctx_alloc(void)

{
  mbedtls_des3_context *des3;
  
  des3 = (mbedtls_des3_context *)calloc(1,0x180);
  if (des3 == (mbedtls_des3_context *)0x0) {
    des3 = (mbedtls_des3_context *)0x0;
  }
  else {
    mbedtls_des3_init(des3);
  }
  return des3;
}

Assistant:

static void * des3_ctx_alloc( void )
{
    mbedtls_des3_context *des3;
    des3 = mbedtls_calloc( 1, sizeof( mbedtls_des3_context ) );

    if( des3 == NULL )
        return( NULL );

    mbedtls_des3_init( des3 );

    return( des3 );
}